

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

double YP_md_get_wheel_torque(YPSpur *spur,double *torque_r,double *torque_l)

{
  int iVar1;
  double time;
  undefined1 auStack_60 [4];
  int len;
  YPSpur_msg msg;
  double *torque_l_local;
  double *torque_r_local;
  YPSpur *spur_local;
  
  _auStack_60 = 1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x103;
  msg.pid._4_4_ = 0;
  msg.data[3] = (double)torque_l;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)auStack_60);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local = (YPSpur *)0xbff0000000000000;
  }
  else {
    iVar1 = (*(spur->dev).recv)(&spur->dev,(YPSpur_msg *)auStack_60);
    if (iVar1 < 0) {
      spur->connection_error = 1;
      spur_local = (YPSpur *)0xbff0000000000000;
    }
    else {
      *torque_r = (double)msg._16_8_;
      *(double *)msg.data[3] = msg.data[0];
      spur_local = (YPSpur *)msg.data[1];
    }
  }
  return (double)spur_local;
}

Assistant:

double YP_md_get_wheel_torque(YPSpur* spur, double* torque_r, double* torque_l)
{
  YPSpur_msg msg;
  int len;
  double time;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_GET_WHEEL_TORQUE;
  msg.cs = 0;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  /* 指定のコマンド受け取り */
  len = spur->dev.recv(&spur->dev, &msg);
  if (len < 0)
  {
    /* receive error */
    spur->connection_error = 1;
    return -1;
  }

  *torque_r = msg.data[0];
  *torque_l = msg.data[1];
  time = msg.data[2];
  return time;
}